

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_rebuild_sorted_global(REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  iVar1 = ref_node->n;
  if ((long)iVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1f6,
           "ref_node_rebuild_sorted_global","malloc pack of REF_INT negative");
    uVar2 = 1;
  }
  else {
    __ptr = malloc((long)iVar1 * 4);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1f6,
             "ref_node_rebuild_sorted_global","malloc pack of REF_INT NULL");
      uVar2 = 2;
    }
    else {
      uVar5 = 0;
      uVar3 = (ulong)(uint)ref_node->max;
      if (ref_node->max < 1) {
        uVar3 = uVar5;
      }
      iVar6 = 0;
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        if (-1 < ref_node->global[uVar5]) {
          ref_node->sorted_global[iVar6] = ref_node->global[uVar5];
          *(int *)((long)__ptr + (long)iVar6 * 4) = (int)uVar5;
          iVar6 = iVar6 + 1;
        }
      }
      uVar2 = ref_sort_heap_glob(iVar1,ref_node->sorted_global,ref_node->sorted_local);
      if (uVar2 == 0) {
        for (lVar4 = 0; lVar4 < ref_node->n; lVar4 = lVar4 + 1) {
          iVar1 = *(int *)((long)__ptr + (long)ref_node->sorted_local[lVar4] * 4);
          ref_node->sorted_local[lVar4] = iVar1;
          ref_node->sorted_global[lVar4] = ref_node->global[iVar1];
        }
        free(__ptr);
        uVar2 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x201,"ref_node_rebuild_sorted_global",(ulong)uVar2,"heap");
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_rebuild_sorted_global(REF_NODE ref_node) {
  REF_INT node, nnode, *pack;

  ref_malloc(pack, ref_node_n(ref_node), REF_INT);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    ref_node->sorted_global[nnode] = ref_node->global[node];
    pack[nnode] = node;
    nnode++;
  }

  RSS(ref_sort_heap_glob(ref_node_n(ref_node), ref_node->sorted_global,
                         ref_node->sorted_local),
      "heap");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    ref_node->sorted_local[node] = pack[ref_node->sorted_local[node]];
    ref_node->sorted_global[node] =
        ref_node->global[ref_node->sorted_local[node]];
  }

  ref_free(pack);
  return REF_SUCCESS;
}